

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_command(void)

{
  Button button;
  allocator local_69;
  __shared_ptr<command::ICommand,_(__gnu_cxx::_Lock_policy)2> local_68;
  string local_58;
  __shared_ptr<command::ICommand,_(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<command::ICommand,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__cxx11::string::string((string *)&local_58,"command",(allocator *)&local_68);
  print_func_begin(&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  local_68._M_ptr = (element_type *)0x0;
  local_68._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<command::FanCommand>();
  local_28._M_ptr = (element_type *)local_58._M_dataplus._M_p;
  local_28._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  std::__shared_ptr<command::ICommand,_(__gnu_cxx::_Lock_policy)2>::operator=(&local_68,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
  (**(local_68._M_ptr)->_vptr_ICommand)();
  std::make_shared<command::LightCommand>();
  local_38._M_ptr = (element_type *)local_58._M_dataplus._M_p;
  local_38._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  std::__shared_ptr<command::ICommand,_(__gnu_cxx::_Lock_policy)2>::operator=(&local_68,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
  (**(local_68._M_ptr)->_vptr_ICommand)();
  std::__cxx11::string::string((string *)&local_58,"command",&local_69);
  print_func_end(&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  return;
}

Assistant:

void test_command() {
    print_func_begin("command");
    command::Button button;
    button.SetCommand(std::make_shared<command::FanCommand>());
    button.PressButton();
    button.SetCommand(std::make_shared<command::LightCommand>());
    button.PressButton();
    print_func_end("command");
}